

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_secret(FCommandLine *argv,APlayerPawn *who,int key)

{
  byte bVar1;
  FBrokenLines *pFVar2;
  int iVar3;
  FString FVar4;
  char *pcVar5;
  long lVar6;
  FBrokenLines *lines;
  undefined8 *puVar7;
  PClass *pPVar8;
  PClass *pPVar9;
  undefined4 extraout_var;
  level_info_t *plVar10;
  undefined8 extraout_RAX;
  uint uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  bool bVar14;
  bool bVar15;
  FString levelname;
  FString linebuild;
  FString maphdr;
  FWadLump lump;
  char readbuffer [1024];
  FString local_4c0;
  int local_4b4;
  char *local_4b0;
  FString local_4a8;
  FString local_4a0;
  FName local_494;
  undefined8 *local_490;
  char *local_488;
  char *local_480;
  ulong local_478;
  FWadLump local_470;
  char local_438 [1032];
  
  iVar3 = FCommandLine::argc(argv);
  FVar4 = level.MapName;
  if (1 < iVar3) {
    FVar4.Chars = FCommandLine::operator[](argv,1);
  }
  local_4b4 = strcasecmp(FVar4.Chars,level.MapName.Chars);
  iVar3 = FWadCollection::CheckNumForName(&Wads,"SECRETS",0);
  if (-1 < iVar3) {
    FWadCollection::OpenLumpNum(&local_470,&Wads,iVar3);
    local_4a0.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    local_480 = FVar4.Chars;
    FString::Format(&local_4a0,"[%s]",FVar4.Chars);
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    local_4b0 = "\x1cV";
    if (local_4b4 == 0) {
      local_4b0 = "\x1cK";
    }
    local_488 = FString::NullString.Nothing;
    local_4a8.Chars = FString::NullString.Nothing;
    bVar14 = false;
    uVar12 = 0;
    while( true ) {
      local_478 = uVar12;
      pcVar5 = FWadLump::Gets(&local_470,local_438,0x400);
      if (pcVar5 == (char *)0x0) break;
      uVar12 = local_478;
      if (bVar14) {
        bVar14 = local_438[0] != '[';
        if ((bVar14) &&
           ((FString::operator+=(&local_4a8,local_438),
            ((FNullStringData *)(local_4a8.Chars + -0xc))->Len < 0x3ff ||
            (uVar12 = local_478, local_4a8.Chars[0x3fe] == '\n')))) {
          FString::Substitute(&local_4a8,"\r",(char *)"");
          FString::StripRight(&local_4a8," \t\n");
          local_4c0.Chars = local_4a8.Chars;
          if (local_4a8.Chars != (char *)0x0) {
            pcVar5 = local_4b0;
            FVar4.Chars = local_4a8.Chars;
            if (*local_4a8.Chars == '$') {
              bVar1 = local_4a8.Chars[1];
              FVar4.Chars = local_4a8.Chars;
              if (bVar1 < 0x73) {
                if (bVar1 == 0x53) {
LAB_00353089:
                  lVar6 = strtol(local_4a8.Chars + 2,&local_4c0.Chars,10);
                  if (*local_4c0.Chars == ';') {
                    local_4c0.Chars = local_4c0.Chars + 1;
                  }
                  pcVar5 = local_4b0;
                  FVar4.Chars = local_4c0.Chars;
                  if (((local_4b4 == 0) && (-1 < lVar6)) && (lVar6 < numsectors)) {
                    if ((int)sectors[lVar6].Flags < 0) goto LAB_003532a9;
                    pcVar5 = "\x1cD";
                    if (sectors[lVar6].Flags < 0x40000000) {
                      pcVar5 = "\x1cI";
                    }
                  }
                }
                else if (bVar1 == 0x54) goto LAB_0035310d;
              }
              else if (bVar1 == 0x74) {
LAB_0035310d:
                lVar6 = strtol(local_4a8.Chars + 2,&local_4c0.Chars,10);
                if (*local_4c0.Chars == ';') {
                  local_4c0.Chars = local_4c0.Chars + 1;
                }
                FVar4.Chars = local_4c0.Chars;
                if ((local_4b4 == 0) && (uVar11 = (uint)lVar6, uVar11 != 0)) {
                  local_490 = (undefined8 *)((long)AActor::TIDHash + (ulong)((uVar11 & 0x7f) << 3));
                  puVar13 = (undefined8 *)0x0;
                  do {
                    puVar7 = puVar13 + 0x57;
                    if (puVar13 == (undefined8 *)0x0) {
                      puVar7 = local_490;
                    }
                    puVar13 = (undefined8 *)*puVar7;
                    while( true ) {
                      if (puVar13 == (undefined8 *)0x0) goto LAB_00353144;
                      if (*(uint *)(puVar13 + 0x52) == uVar11) break;
                      puVar13 = (undefined8 *)puVar13[0x57];
                    }
                    local_494.Index =
                         FName::NameManager::FindName(&FName::NameData,"SecretTrigger",true);
                    pPVar8 = PClass::FindClass(&local_494);
                    pPVar9 = (PClass *)puVar13[1];
                    if (pPVar9 == (PClass *)0x0) {
                      pPVar9 = (PClass *)(**(code **)*puVar13)(puVar13);
                      puVar13[1] = pPVar9;
                    }
                    bVar15 = pPVar9 != (PClass *)0x0;
                    if (pPVar9 != pPVar8 && bVar15) {
                      do {
                        pPVar9 = pPVar9->ParentClass;
                        bVar15 = pPVar9 != (PClass *)0x0;
                        if (pPVar9 == pPVar8) break;
                      } while (pPVar9 != (PClass *)0x0);
                    }
                  } while (!bVar15);
LAB_003532a9:
                  pcVar5 = "\x1cG";
                }
                else {
LAB_00353144:
                  pcVar5 = "\x1cD";
                }
              }
              else if (bVar1 == 0x73) goto LAB_00353089;
            }
            lines = V_BreakLines(ConFont,((screen->super_DSimpleCanvas).super_DCanvas.Width * 0x5f)
                                         / 100,(BYTE *)FVar4.Chars,false);
            iVar3 = lines->Width;
            pFVar2 = lines;
            while (-1 < iVar3) {
              Printf("%s%s\n",pcVar5,(pFVar2->Text).Chars);
              iVar3 = pFVar2[1].Width;
              pFVar2 = pFVar2 + 1;
            }
            V_FreeBrokenLines(lines);
          }
          FString::operator=(&local_4a8,(char *)"");
          uVar12 = local_478;
        }
      }
      else {
        bVar14 = false;
        if (local_438[0] == '[') {
          iVar3 = strncasecmp(local_438,local_4a0.Chars,
                              (ulong)((FNullStringData *)(local_4a0.Chars + -0xc))->Len);
          pcVar5 = local_480;
          bVar14 = iVar3 == 0;
          uVar12 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
          if ((local_478 & 1) == 0) {
            local_4c0.Chars = local_488;
            FString::NullString.RefCount = FString::NullString.RefCount + 1;
            plVar10 = FindLevelInfo(local_480,true);
            if ((plVar10->flags & 0x4000000) != 0) {
              FStringTable::operator[](&GStrings,(plVar10->LevelName).Chars);
            }
            FString::Format(&local_4c0,"%s - %s\n",pcVar5);
            uVar12 = (ulong)((FNullStringData *)(local_4c0.Chars + -0xc))->Len;
            while (uVar12 = uVar12 - 1, uVar12 != 0) {
              FString::operator+=(&local_4c0,'-');
            }
            Printf("\x1cK%s\n",local_4c0.Chars);
            FString::~FString(&local_4c0);
            uVar12 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
        }
      }
    }
    FString::~FString(&local_4a8);
    FString::~FString(&local_4a0);
    FWadLump::~FWadLump(&local_470);
  }
  return;
}

Assistant:

CCMD(secret)
{
	const char *mapname = argv.argc() < 2? level.MapName.GetChars() : argv[1];
	bool thislevel = !stricmp(mapname, level.MapName);
	bool foundsome = false;

	int lumpno=Wads.CheckNumForName("SECRETS");
	if (lumpno < 0) return;

	FWadLump lump = Wads.OpenLumpNum(lumpno);
	FString maphdr;
	maphdr.Format("[%s]", mapname);

	FString linebuild;
	char readbuffer[1024];
	bool inlevel = false;

	while (lump.Gets(readbuffer, 1024))
	{
		if (!inlevel)
		{
			if (readbuffer[0] == '[')
			{
				inlevel = !strnicmp(readbuffer, maphdr, maphdr.Len());
				if (!foundsome)
				{
					FString levelname;
					level_info_t *info = FindLevelInfo(mapname);
					const char *ln = !(info->flags & LEVEL_LOOKUPLEVELNAME)? info->LevelName.GetChars() : GStrings[info->LevelName.GetChars()];
					levelname.Format("%s - %s\n", mapname, ln);
					size_t llen = levelname.Len() - 1;
					for(size_t ii=0; ii<llen; ii++) levelname += '-';
					Printf(TEXTCOLOR_YELLOW"%s\n", levelname.GetChars());
					foundsome = true;
				}
			}
			continue;
		}
		else
		{
			if (readbuffer[0] != '[')
			{
				linebuild += readbuffer;
				if (linebuild.Len() < 1023 || linebuild[1022] == '\n')
				{
					// line complete so print it.
					linebuild.Substitute("\r", "");
					linebuild.StripRight(" \t\n");
					PrintSecretString(linebuild, thislevel);
					linebuild = "";
				}
			}
			else inlevel = false;
		}
	}
}